

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLSSetMassUserData(ARKodeMem ark_mem,void *user_data)

{
  ARKodeMem in_RSI;
  int retval;
  ARKLsMassMem arkls_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessMassMem(in_RSI,in_stack_ffffffffffffffe0,
                                (ARKLsMassMem *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    if (*(long *)(in_stack_ffffffffffffffe0 + 8) != 0) {
      *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0x20) = in_RSI;
    }
    *(ARKodeMem *)(in_stack_ffffffffffffffe0 + 0xc0) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int arkLSSetMassUserData(ARKodeMem ark_mem, void* user_data)
{
  ARKLsMassMem arkls_mem;
  int retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessMassMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARKLS_SUCCESS) { return (retval); }

  /* Set data for mass matrix */
  if (arkls_mem->mass != NULL) { arkls_mem->M_data = user_data; }

  /* Data for Mtimes is set in arkLSSetMassTimes */

  /* Set data for Preconditioner */
  arkls_mem->P_data = user_data;

  return (ARKLS_SUCCESS);
}